

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void highbd_dr_prediction_z3_64x64_avx2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *left,int upsample_left,int dy,int bd)

{
  int in_R9D;
  uint16_t dstT [4096];
  int in_stack_ffffffffffffdfe0;
  int in_stack_ffffffffffffdfe4;
  ptrdiff_t in_stack_ffffffffffffdfe8;
  uint16_t *in_stack_ffffffffffffdff0;
  ptrdiff_t in_stack_ffffffffffffdff8;
  uint16_t *in_stack_ffffffffffffe000;
  int in_stack_ffffffffffffe208;
  int in_stack_ffffffffffffe20c;
  uint16_t *in_stack_ffffffffffffe210;
  ptrdiff_t in_stack_ffffffffffffe218;
  uint16_t *in_stack_ffffffffffffe220;
  int in_stack_ffffffffffffe22c;
  int in_stack_ffffffffffffe2a8;
  int in_stack_ffffffffffffe2ac;
  uint16_t *in_stack_ffffffffffffe2b0;
  ptrdiff_t in_stack_ffffffffffffe2b8;
  uint16_t *in_stack_ffffffffffffe2c0;
  int in_stack_ffffffffffffe2c8;
  
  if (in_R9D < 0xc) {
    highbd_dr_prediction_z1_64xN_avx2
              (in_stack_ffffffffffffe22c,in_stack_ffffffffffffe220,in_stack_ffffffffffffe218,
               in_stack_ffffffffffffe210,in_stack_ffffffffffffe20c,in_stack_ffffffffffffe208);
  }
  else {
    highbd_dr_prediction_32bit_z1_64xN_avx2
              (in_stack_ffffffffffffe2c8,in_stack_ffffffffffffe2c0,in_stack_ffffffffffffe2b8,
               in_stack_ffffffffffffe2b0,in_stack_ffffffffffffe2ac,in_stack_ffffffffffffe2a8);
  }
  highbd_transpose(in_stack_ffffffffffffe000,in_stack_ffffffffffffdff8,in_stack_ffffffffffffdff0,
                   in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe4,in_stack_ffffffffffffdfe0);
  return;
}

Assistant:

static void highbd_dr_prediction_z3_64x64_avx2(uint16_t *dst, ptrdiff_t stride,
                                               const uint16_t *left,
                                               int upsample_left, int dy,
                                               int bd) {
  DECLARE_ALIGNED(16, uint16_t, dstT[64 * 64]);
  if (bd < 12) {
    highbd_dr_prediction_z1_64xN_avx2(64, dstT, 64, left, upsample_left, dy);
  } else {
    highbd_dr_prediction_32bit_z1_64xN_avx2(64, dstT, 64, left, upsample_left,
                                            dy);
  }
  highbd_transpose(dstT, 64, dst, stride, 64, 64);
}